

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseBasicPrimAttr<tinyusdz::value::half>
          (AsciiParser *this,bool array_qual,string *primattr_name,Attribute *out_attr)

{
  bool bVar1;
  ostream *poVar2;
  value_type *v;
  AttrMeta *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  string local_b20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ae0;
  ValueBlock local_ab9;
  undefined1 local_ab8 [7];
  ValueBlock noneval;
  ostringstream local_a98 [8];
  ostringstream ss_e_2;
  undefined1 local_920 [8];
  AttrMeta meta;
  string local_6f8 [32];
  string local_6d8 [32];
  ostringstream local_6b8 [8];
  ostringstream ss_e_1;
  optional<tinyusdz::value::half> local_540;
  int local_53c;
  optional<tinyusdz::value::half> value_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  allocator local_4f1;
  string local_4f0 [32];
  string local_4d0;
  ostringstream local_4b0 [8];
  ostringstream ss_e;
  undefined1 local_338 [8];
  vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> value;
  undefined1 local_318 [7];
  bool blocked;
  PrimVar var;
  Attribute attr;
  Attribute *out_attr_local;
  string *primattr_name_local;
  bool array_qual_local;
  AsciiParser *this_local;
  
  Attribute::Attribute((Attribute *)&var._ts._dirty);
  primvar::PrimVar::PrimVar((PrimVar *)local_318);
  value.super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  if (array_qual) {
    bVar1 = MaybeNone(this);
    if (!bVar1) {
      ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::vector
                ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)local_338)
      ;
      bVar1 = ParseBasicTypeArray<tinyusdz::value::half>
                        (this,(vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>
                               *)local_338);
      if (bVar1) {
        primvar::PrimVar::
        set_value<std::vector<tinyusdz::value::half,std::allocator<tinyusdz::value::half>>>
                  ((PrimVar *)local_318,
                   (vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)
                   local_338);
        local_53c = 0;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_4b0);
        poVar2 = ::std::operator<<((ostream *)local_4b0,"[error]");
        poVar2 = ::std::operator<<(poVar2,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                  );
        poVar2 = ::std::operator<<(poVar2,":");
        poVar2 = ::std::operator<<(poVar2,"ParseBasicPrimAttr");
        poVar2 = ::std::operator<<(poVar2,"():");
        poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xdf9);
        ::std::operator<<(poVar2," ");
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_4f0,"Failed to parse Primtive Attribute {} type = {}[]",&local_4f1);
        tinyusdz::value::TypeTraits<tinyusdz::value::half>::type_name_abi_cxx11_();
        fmt::format<std::__cxx11::string,std::__cxx11::string>
                  (&local_4d0,(fmt *)local_4f0,primattr_name,&local_518,in_R8);
        poVar2 = ::std::operator<<((ostream *)local_4b0,(string *)&local_4d0);
        ::std::operator<<(poVar2,"\n");
        ::std::__cxx11::string::~string((string *)&local_4d0);
        ::std::__cxx11::string::~string((string *)&local_518);
        ::std::__cxx11::string::~string(local_4f0);
        ::std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
        ::std::__cxx11::ostringstream::str();
        PushError(this,(string *)&value_1);
        ::std::__cxx11::string::~string((string *)&value_1);
        this_local._7_1_ = 0;
        local_53c = 1;
        ::std::__cxx11::ostringstream::~ostringstream(local_4b0);
      }
      ::std::vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>::~vector
                ((vector<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_> *)local_338)
      ;
      goto joined_r0x0063fffa;
    }
  }
  else {
    nonstd::optional_lite::optional<tinyusdz::value::half>::optional(&local_540);
    bVar1 = ReadBasicType(this,&local_540);
    if (bVar1) {
      bVar1 = nonstd::optional_lite::optional::operator_cast_to_bool((optional *)&local_540);
      if (bVar1) {
        v = nonstd::optional_lite::optional<tinyusdz::value::half>::value(&local_540);
        primvar::PrimVar::set_value<tinyusdz::value::half>((PrimVar *)local_318,v);
      }
      else {
        value.super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ = 1;
      }
      local_53c = 0;
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream(local_6b8);
      poVar2 = ::std::operator<<((ostream *)local_6b8,"[error]");
      poVar2 = ::std::operator<<(poVar2,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar2 = ::std::operator<<(poVar2,":");
      poVar2 = ::std::operator<<(poVar2,"ParseBasicPrimAttr");
      poVar2 = ::std::operator<<(poVar2,"():");
      poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xe2f);
      ::std::operator<<(poVar2," ");
      tinyusdz::value::TypeTraits<tinyusdz::value::half>::type_name_abi_cxx11_();
      ::std::operator+((char *)local_6d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       "Failed to parse ");
      poVar2 = ::std::operator<<((ostream *)local_6b8,local_6d8);
      ::std::operator<<(poVar2,"\n");
      ::std::__cxx11::string::~string(local_6d8);
      ::std::__cxx11::string::~string(local_6f8);
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)
                     &meta.stringData.
                      super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__cxx11::string::~string
                ((string *)
                 &meta.stringData.
                  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      this_local._7_1_ = 0;
      local_53c = 1;
      ::std::__cxx11::ostringstream::~ostringstream(local_6b8);
    }
    nonstd::optional_lite::optional<tinyusdz::value::half>::~optional(&local_540);
joined_r0x0063fffa:
    if (local_53c != 0) goto LAB_00640226;
  }
  AttrMetas::AttrMetas((AttrMetas *)local_920);
  bVar1 = ParseAttrMeta(this,(AttrMeta *)local_920);
  if (bVar1) {
    this_00 = Attribute::metas((Attribute *)&var._ts._dirty);
    AttrMetas::operator=(this_00,(AttrMetas *)local_920);
    if ((value.super__Vector_base<tinyusdz::value::half,_std::allocator<tinyusdz::value::half>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
      Attribute::set_var((Attribute *)&var._ts._dirty,(PrimVar *)local_318);
    }
    else {
      Attribute::set_value<tinyusdz::value::ValueBlock>((Attribute *)&var._ts._dirty,&local_ab9);
      Attribute::set_blocked((Attribute *)&var._ts._dirty,true);
      if (array_qual) {
        tinyusdz::value::TypeTraits<tinyusdz::value::half>::type_name_abi_cxx11_();
        ::std::operator+(&local_ae0,&local_b00,"[]");
        Attribute::set_type_name((Attribute *)&var._ts._dirty,&local_ae0);
        ::std::__cxx11::string::~string((string *)&local_ae0);
        ::std::__cxx11::string::~string((string *)&local_b00);
      }
      else {
        tinyusdz::value::TypeTraits<tinyusdz::value::half>::type_name_abi_cxx11_();
        Attribute::set_type_name((Attribute *)&var._ts._dirty,&local_b20);
        ::std::__cxx11::string::~string((string *)&local_b20);
      }
    }
    Attribute::operator=(out_attr,(Attribute *)&var._ts._dirty);
    this_local._7_1_ = 1;
    local_53c = 1;
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream(local_a98);
    poVar2 = ::std::operator<<((ostream *)local_a98,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ParseBasicPrimAttr");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0xe43);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_a98,"Failed to parse Attribute meta.");
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,(string *)local_ab8);
    ::std::__cxx11::string::~string((string *)local_ab8);
    this_local._7_1_ = 0;
    local_53c = 1;
    ::std::__cxx11::ostringstream::~ostringstream(local_a98);
  }
  AttrMetas::~AttrMetas((AttrMetas *)local_920);
LAB_00640226:
  primvar::PrimVar::~PrimVar((PrimVar *)local_318);
  Attribute::~Attribute((Attribute *)&var._ts._dirty);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::ParseBasicPrimAttr(bool array_qual,
                                     const std::string &primattr_name,
                                     Attribute *out_attr) {
  Attribute attr;
  primvar::PrimVar var;
  bool blocked{false};

  if (array_qual) {
    if (MaybeNone()) {
    } else {
      std::vector<T> value;
      if (!ParseBasicTypeArray(&value)) {
        PUSH_ERROR_AND_RETURN(fmt::format("Failed to parse Primtive Attribute {} type = {}[]", primattr_name,
                              std::string(value::TypeTraits<T>::type_name())));
      }

      // Empty array allowed.
      DCOUT("Got it: primatrr " << primattr_name << ", ty = " + std::string(value::TypeTraits<T>::type_name()) +
            ", sz = " + std::to_string(value.size()));
      var.set_value(value);
    }

#if 0
  // FIXME: Disable duplicated parsing attribute connection here, since parsing attribute connection will be handled in ParsePrimProps().
  } else if (hasConnect(primattr_name)) {
    std::string value;  // TODO: Use Path
    if (!ReadPathIdentifier(&value)) {
      PUSH_ERROR_AND_RETURN("Failed to parse path identifier.");
    }

    // validate.
    Path connectionPath = pathutil::FromString(value);
    if (!connectionPath.is_valid()) {
      PUSH_ERROR_AND_RETURN(fmt::format("Invalid connectionPath: {}.", value));
    }

    // Resolve relative path here.
    // NOTE: Internally, USD(Crate) does not allow relative path.
    Path base_prim_path(GetCurrentPrimPath(), "");
    Path abs_path;
    if (!pathutil::ResolveRelativePath(base_prim_path, connectionPath,
                                       &abs_path)) {
      PUSH_ERROR_AND_RETURN(fmt::format("Invalid relative Path: {}.", value));
    }

    // TODO: Use Path
    var.set_value(abs_path.full_path_name());

    // Check if attribute metadatum is not authored.
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    char c;
    if (!LookChar1(&c)) {
      return false;
    }

    if (c == '(') {
      PUSH_ERROR_AND_RETURN(fmt::format("Attribute connection cannot have attribute metadataum: {}", primattr_name));
    }

#endif
  } else {
    nonstd::optional<T> value;
    if (!ReadBasicType(&value)) {
      PUSH_ERROR_AND_RETURN("Failed to parse " +
                            std::string(value::TypeTraits<T>::type_name()));
    }

    if (value) {
      DCOUT("ParseBasicPrimAttr: " << value::TypeTraits<T>::type_name() << " = "
                                   << (*value));

      var.set_value(value.value());

    } else {
      blocked = true;
      // std::cout << "ParseBasicPrimAttr: " <<
      // value::TypeTraits<T>::type_name()
      //           << " = None\n";
    }
  }

  // optional: attribute meta.
  AttrMeta meta;
  if (!ParseAttrMeta(&meta)) {
    PUSH_ERROR_AND_RETURN("Failed to parse Attribute meta.");
  }
  attr.metas() = meta;

  if (blocked) {
    // There is still have a type for ValueBlock.
    value::ValueBlock noneval;
    attr.set_value(noneval);
    attr.set_blocked(true);
    if (array_qual) {
      attr.set_type_name(value::TypeTraits<T>::type_name() + "[]");
    } else {
      attr.set_type_name(value::TypeTraits<T>::type_name());
    }
  } else {
    attr.set_var(std::move(var));
  }

  (*out_attr) = std::move(attr);

  return true;
}